

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_buffer.c
# Opt level: O2

int bufferResetArgs(mpt_iterator *it)

{
  int iVar1;
  
  iVar1 = bufferReset(it);
  if (0 < iVar1) {
    iVar1 = bufferAdvance(it);
    return iVar1;
  }
  return iVar1;
}

Assistant:

static int bufferResetArgs(MPT_INTERFACE(iterator) *it)
{
	MPT_STRUCT(metaBuffer) *m = MPT_baseaddr(metaBuffer, it, _it);
	int ret;
	if ((ret = bufferReset(&m->_it)) <= 0) {
		return ret;
	}
	/* consume first argument of iterator */
	return bufferAdvance(&m->_it);
}